

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O1

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  Env *pEVar1;
  long *plVar2;
  long *plVar3;
  pointer pcVar4;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tmp;
  string manifest;
  long *local_d0;
  size_t local_c8;
  long local_c0;
  long lStack_b8;
  Env *local_b0;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  void *local_68;
  string local_60;
  Slice local_40;
  
  local_b0 = env;
  DescriptorFileName(&local_60,dbname,descriptor_number);
  pcVar5 = local_60._M_dataplus._M_p + dbname->_M_string_length + 1;
  pcVar4 = local_60._M_dataplus._M_p + local_60._M_string_length;
  MakeFileName(&local_a8,dbname,descriptor_number,"dbtmp");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,pcVar5,pcVar4);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_88);
  pEVar1 = local_b0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_40.data_ = (char *)local_d0;
  local_40.size_ = local_c8;
  WriteStringToFileSync(this,local_b0,&local_40,&local_a8);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (*(long *)this == 0) {
    pcVar4 = (dbname->_M_dataplus)._M_p;
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar4,pcVar4 + dbname->_M_string_length);
    std::__cxx11::string::append((char *)&local_d0);
    (*pEVar1->_vptr_Env[0xc])(local_88,pEVar1,&local_a8,(string *)&local_d0);
    plVar2 = *(long **)this;
    *(long **)this = local_88[0];
    local_88[0] = plVar2;
    if (plVar2 != (long *)0x0) {
      operator_delete__(plVar2);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
  }
  if (*(long *)this != 0) {
    (*pEVar1->_vptr_Env[8])(&local_68,pEVar1,&local_a8);
    if (local_68 != (void *)0x0) {
      operator_delete__(local_68);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return (Status)(char *)this;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}